

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_bump_headersize(Curl_easy *data,size_t delta,_Bool connect_only)

{
  uint *puVar1;
  uint uVar2;
  ulong in_RAX;
  uint uVar3;
  undefined8 uVar4;
  ulong uVar5;
  int iVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  
  if (delta < 0x4b000) {
    iVar6 = (int)delta;
    uVar2 = (data->info).header_size + iVar6;
    in_RAX = (ulong)uVar2;
    (data->info).header_size = uVar2;
    uVar3 = (data->req).allheadercount + iVar6;
    (data->req).allheadercount = uVar3;
    if (!connect_only) {
      puVar1 = &(data->req).headerbytecount;
      *puVar1 = *puVar1 + iVar6;
    }
    if (uVar3 < 0x4b001) {
      uVar5 = 0;
      if (0x5dc000 < uVar2) {
        uVar5 = (ulong)uVar2;
      }
      in_RAX = 0x5dc000;
      uVar4 = 0x4b000;
      if (0x5dc000 < uVar2) {
        uVar4 = 0x5dc000;
      }
      goto LAB_00137275;
    }
    uVar5 = (ulong)uVar3;
  }
  else {
    uVar5 = (data->req).allheadercount + delta;
  }
  uVar4 = 0x4b000;
LAB_00137275:
  if (uVar5 != 0) {
    Curl_failf(data,"Too large response headers: %zu > %u",uVar5,uVar4,in_R8,in_R9,in_RAX);
    return CURLE_RECV_ERROR;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_bump_headersize(struct Curl_easy *data,
                              size_t delta,
                              bool connect_only)
{
  size_t bad = 0;
  unsigned int max = MAX_HTTP_RESP_HEADER_SIZE;
  if(delta < MAX_HTTP_RESP_HEADER_SIZE) {
    data->info.header_size += (unsigned int)delta;
    data->req.allheadercount += (unsigned int)delta;
    if(!connect_only)
      data->req.headerbytecount += (unsigned int)delta;
    if(data->req.allheadercount > max)
      bad = data->req.allheadercount;
    else if(data->info.header_size > (max * 20)) {
      bad = data->info.header_size;
      max *= 20;
    }
  }
  else
    bad = data->req.allheadercount + delta;
  if(bad) {
    failf(data, "Too large response headers: %zu > %u", bad, max);
    return CURLE_RECV_ERROR;
  }
  return CURLE_OK;
}